

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_connection_base.cpp
# Opt level: O2

int __thiscall libtorrent::aux::web_connection_base::timeout(web_connection_base *this)

{
  int iVar1;
  
  iVar1 = session_settings::get_int
                    ((this->super_peer_connection).super_peer_connection_hot_members.m_settings,
                     0x400b);
  return iVar1;
}

Assistant:

int web_connection_base::timeout() const
	{
		// since this is a web seed, change the timeout
		// according to the settings.
		return m_settings.get_int(settings_pack::urlseed_timeout);
	}